

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall nigel::Lexer::printLexerStructure(Lexer *this,CodeBase *base)

{
  ulong __val;
  _List_node_base *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  double __x;
  char cVar3;
  long *plVar4;
  ulong uVar5;
  long *plVar6;
  list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_> *plVar7;
  char cVar8;
  _List_node_base *p_Var9;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_00;
  string __str;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  uint local_48;
  long local_40 [2];
  
  __val = (base->lexerStruct).
          super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
          ._M_impl._M_node._M_size;
  cVar8 = '\x01';
  if (9 < __val) {
    uVar5 = __val;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (uVar5 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00166785;
      }
      if (uVar5 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00166785;
      }
      if (uVar5 < 10000) goto LAB_00166785;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar8 + '\x04';
    } while (bVar2);
    cVar8 = cVar8 + '\x01';
  }
LAB_00166785:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1775a7);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    uVar10 = (undefined4)*plVar6;
    uVar11 = *(undefined4 *)((long)plVar4 + 0x14);
    local_80 = *plVar6;
    uStack_78 = (undefined4)plVar4[3];
    uStack_74 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    uVar10 = extraout_XMM0_Da;
    uVar11 = extraout_XMM0_Db;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  helper::log((helper *)&local_90,(double)CONCAT44(uVar11,uVar10));
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  plVar7 = &base->lexerStruct;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  p_Var9 = (plVar7->
           super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)plVar7) {
    do {
      p_Var1 = p_Var9[1]._M_next;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9[1]._M_prev;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      __x = (double)(**(code **)((long)p_Var1->_M_next + 0x10))((helper *)&local_90,p_Var1,1);
      helper::log((helper *)&local_90,__x);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != (_List_node_base *)plVar7);
  }
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Lexer end","");
  helper::log((helper *)&local_90,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  return;
}

Assistant:

void Lexer::printLexerStructure( CodeBase & base )
	{
		log( "Lexer structure (" + to_string( base.lexerStruct.size() ) + " items): " );
		for( auto l : base.lexerStruct )
		{
			log( l->toString( true ) );
		}
		log( "Lexer end" );
	}